

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

void __thiscall ON_String::MakeLowerOrdinal(ON_String *this)

{
  int element_count;
  int length;
  ON_String *this_local;
  
  CopyArray(this);
  element_count = Length(this);
  if (0 < element_count) {
    MapStringOrdinal(LowerOrdinal,this->m_s,element_count,this->m_s,element_count);
  }
  return;
}

Assistant:

void ON_String::MakeLowerOrdinal()
{
 	CopyArray();
  const int length = Length();
  if (length > 0)
    ON_String::MapStringOrdinal(
    ON_StringMapOrdinalType::LowerOrdinal,
    m_s,
    length,
    m_s,
    length
    );
}